

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,false,true>
               (date_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  undefined4 left;
  undefined4 left_00;
  undefined4 left_01;
  unsigned_long *puVar1;
  ulong uVar2;
  int64_t iVar3;
  timestamp_t tVar4;
  timestamp_t *ptVar5;
  timestamp_t *ptVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      left_01 = rdata->months;
      iVar3 = rdata->micros;
      iVar10 = 0;
      iVar7 = count;
      do {
        right_01.micros = iVar7;
        right_01._0_8_ = iVar3;
        tVar4 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                          ((AddOperator *)(ulong)(uint)ldata[iVar10].days,(date_t)left_01,right_01);
        result_data[iVar10].value = tVar4.value;
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    ptVar5 = (timestamp_t *)0x0;
    uVar11 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar8 = count;
        }
LAB_009669da:
        uVar9 = uVar11;
        if (uVar11 < uVar8) {
          left = rdata->months;
          iVar3 = rdata->micros;
          ptVar6 = ptVar5;
          do {
            right.micros = (int64_t)ptVar6;
            right._0_8_ = iVar3;
            tVar4 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                              ((AddOperator *)(ulong)(uint)ldata[uVar11].days,(date_t)left,right);
            result_data[uVar11].value = tVar4.value;
            uVar11 = uVar11 + 1;
            uVar9 = uVar8;
          } while (uVar8 != uVar11);
        }
      }
      else {
        uVar2 = puVar1[(long)ptVar5];
        uVar8 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar8 = count;
        }
        uVar9 = uVar8;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_009669da;
          uVar9 = uVar11;
          if (uVar11 < uVar8) {
            uVar12 = 0;
            ptVar6 = ptVar5;
            do {
              if ((uVar2 >> (uVar12 & 0x3f) & 1) != 0) {
                left_00 = rdata->months;
                right_00.micros = (int64_t)ptVar6;
                right_00._0_8_ = rdata->micros;
                tVar4 = AddOperator::
                        Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                  ((AddOperator *)(ulong)(uint)ldata[uVar11 + uVar12].days,
                                   (date_t)left_00,right_00);
                (result_data + uVar11)[uVar12].value = tVar4.value;
                ptVar6 = result_data + uVar11;
              }
              uVar12 = uVar12 + 1;
              uVar9 = uVar8;
            } while (uVar8 - uVar11 != uVar12);
          }
        }
      }
      ptVar5 = (timestamp_t *)((long)&ptVar5->value + 1);
      uVar11 = uVar9;
    } while (ptVar5 != (timestamp_t *)(count + 0x3f >> 6));
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}